

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::VarToNativeArray
               (Var arrayObject,JsNativeValueType valueType,UINT length,UINT elementSize,
               byte *buffer,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  Var buffer_00;
  ScriptContext *scriptContext_00;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  DynamicObject *pDVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  JavascriptArray *arrayObject_00;
  JavascriptNativeIntArray *arrayObject_01;
  JavascriptNativeFloatArray *arrayObject_02;
  Var local_50;
  Var arrayObject_local;
  ScriptContext *local_40;
  UINT local_34;
  
  local_50 = arrayObject;
  local_34 = elementSize;
  pDVar6 = VarTo<Js::DynamicObject>(arrayObject);
  iVar4 = (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])(pDVar6);
  if ((-1 < (int)length) && (iVar4 == 0)) {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(arrayObject);
    if (arrayObject == (Var)0x0) {
      AssertCount = AssertCount + 1;
      arrayObject_local = buffer;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_009aa594;
      *puVar7 = 0;
      buffer = (byte *)arrayObject_local;
    }
    bVar3 = TaggedInt::Is(arrayObject);
    if ((ulong)arrayObject >> 0x32 != 0 || bVar3) goto LAB_009aa3f0;
    arrayObject_local = buffer;
    this = UnsafeVarTo<Js::RecyclableObject>(arrayObject);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      local_40 = (ScriptContext *)__tls_get_addr(&PTR_013e5f18);
      *(undefined4 *)&(local_40->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_009aa594;
      *(undefined4 *)&(local_40->super_ScriptContextInfo)._vptr_ScriptContextInfo = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    local_40 = scriptContext;
    if (0x57 < (int)TVar1) {
      BVar5 = RecyclableObject::IsExternal(this);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_009aa594:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
    scriptContext_00 = local_40;
    buffer_00 = arrayObject_local;
    if (TVar1 == TypeIds_ArrayLast) {
      arrayObject_02 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(arrayObject);
      ObjectToNativeArray<Js::JavascriptNativeFloatArray>
                (arrayObject_02,valueType,length,local_34,(byte *)arrayObject_local,local_40);
      return;
    }
    if (TVar1 == TypeIds_NativeIntArray) {
      arrayObject_01 = UnsafeVarTo<Js::JavascriptNativeIntArray>(arrayObject);
      ObjectToNativeArray<Js::JavascriptNativeIntArray>
                (arrayObject_01,valueType,length,local_34,(byte *)buffer_00,local_40);
      return;
    }
    buffer = (byte *)arrayObject_local;
    scriptContext = local_40;
    if (TVar1 == TypeIds_Array) {
      arrayObject_00 = UnsafeVarTo<Js::JavascriptArray>(arrayObject);
      ObjectToNativeArray<Js::JavascriptArray>
                (arrayObject_00,valueType,length,local_34,(byte *)buffer_00,scriptContext_00);
      return;
    }
  }
LAB_009aa3f0:
  ObjectToNativeArray<void*>(&local_50,valueType,length,local_34,buffer,scriptContext);
  return;
}

Assistant:

void JavascriptOperators::VarToNativeArray(Var arrayObject,
        JsNativeValueType valueType,
        __in UINT length,
        __in UINT elementSize,
        __out_bcount(length*elementSize) byte* buffer,
        Js::ScriptContext* scriptContext)
    {
        Js::DynamicObject* dynamicObject = VarTo<DynamicObject>(arrayObject);
        if (dynamicObject->IsCrossSiteObject() || Js::TaggedInt::IsOverflow(length))
        {
            Js::JavascriptOperators::ObjectToNativeArray(&arrayObject, valueType, length, elementSize, buffer, scriptContext);
        }
        else
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayObject);
#endif
            switch (Js::JavascriptOperators::GetTypeId(arrayObject))
            {
            case TypeIds_Array:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
            case TypeIds_NativeFloatArray:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptNativeFloatArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
            case TypeIds_NativeIntArray:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptNativeIntArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
                // We can have more specialized template if needed.
            default:
                Js::JavascriptOperators::ObjectToNativeArray(&arrayObject, valueType, length, elementSize, buffer, scriptContext);
            }
        }
    }